

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Launcher.cpp
# Opt level: O0

shared_ptr<Engine> __thiscall Launcher::getAggregateEngine(Launcher *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Engine> *in_RSI;
  shared_ptr<Engine> *in_RDI;
  shared_ptr<Engine> sVar1;
  
  std::shared_ptr<Engine>::shared_ptr(in_RSI,in_RDI);
  sVar1.super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<Engine>)sVar1.super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Engine> Launcher::getAggregateEngine()
{
	return _engine;
}